

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safecrt.h
# Opt level: O3

errno_t strncpy_s(char *_Dst,size_t _SizeInBytes,char *_Src,size_t _Count)

{
  char cVar1;
  size_t sVar2;
  ulong uVar3;
  errno_t eVar4;
  long lVar5;
  char *__s;
  size_t sVar6;
  
  eVar4 = 0;
  if ((_Count == 0 && _SizeInBytes == 0) && _Dst == (char *)0x0) {
    return 0;
  }
  if (_Dst == (char *)0x0 || _SizeInBytes == 0) {
LAB_0010dd1e:
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
    eVar4 = 0x16;
  }
  else {
    if (_Count == 0) {
      *_Dst = '\0';
      if (_SizeInBytes < 2) {
        return 0;
      }
      __s = _Dst + 1;
      sVar6 = _SizeInBytes - 1;
    }
    else {
      if (_Src == (char *)0x0) {
        *_Dst = '\0';
        if (1 < _SizeInBytes) {
          memset(_Dst + 1,0xfd,_SizeInBytes - 1);
        }
        goto LAB_0010dd1e;
      }
      if (_Count == 0xffffffffffffffff) {
        sVar2 = 0;
        do {
          cVar1 = _Src[sVar2];
          _Dst[sVar2] = cVar1;
          if (cVar1 == '\0') {
            lVar5 = _SizeInBytes - sVar2;
            goto LAB_0010de2e;
          }
          sVar2 = sVar2 + 1;
        } while (_SizeInBytes != sVar2);
LAB_0010de19:
        _Dst[_SizeInBytes - 1] = '\0';
        return 0x50;
      }
      lVar5 = _SizeInBytes - _Count;
      sVar6 = 0;
      do {
        cVar1 = _Src[sVar6];
        _Dst[sVar6] = cVar1;
        if (cVar1 == '\0') {
          lVar5 = _SizeInBytes - sVar6;
          goto LAB_0010de2e;
        }
        if (_SizeInBytes - 1 == sVar6) {
          if (_Count - _SizeInBytes != -2) {
            *_Dst = '\0';
            if (1 < _SizeInBytes) {
              memset(_Dst + 1,0xfd,_SizeInBytes - 1);
            }
            RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
            return 0x22;
          }
          goto LAB_0010de19;
        }
        sVar6 = sVar6 + 1;
      } while (_Count != sVar6);
      _Dst[sVar6] = '\0';
LAB_0010de2e:
      uVar3 = (_SizeInBytes - lVar5) + 1;
      sVar6 = _SizeInBytes - uVar3;
      if (_SizeInBytes < uVar3 || sVar6 == 0) {
        return 0;
      }
      __s = _Dst + uVar3;
    }
    memset(__s,0xfd,sVar6);
  }
  return eVar4;
}

Assistant:

_SAFECRT__INLINE
errno_t __cdecl strncpy_s(char *_Dst, size_t _SizeInBytes, const char *_Src, size_t _Count)
{
    char *p;
    size_t available;

    if (_Count == 0 && _Dst == nullptr && _SizeInBytes == 0)
    {
        /* this case is allowed; nothing to do */
        return 0;
    }

    /* validation section */
    _SAFECRT__VALIDATE_STRING(_Dst, _SizeInBytes);
    if (_Count == 0)
    {
        /* notice that the source string pointer can be nullptr in this case */
        _SAFECRT__RESET_STRING(_Dst, _SizeInBytes);
        return 0;
    }
    _SAFECRT__VALIDATE_POINTER_RESET_STRING(_Src, _Dst, _SizeInBytes);

    p = _Dst;
    available = _SizeInBytes;
    if (_Count == _TRUNCATE)
    {
        while ((*p++ = *_Src++) != 0 && --available > 0)
        {
        }
    }
    else
    {
        while ((*p++ = *_Src++) != 0 && --available > 0 && --_Count > 0)
        {
        }
        if (_Count == 0)
        {
            *p = 0;
        }
    }

    if (available == 0)
    {
        if (_Count == _TRUNCATE)
        {
            _Dst[_SizeInBytes - 1] = 0;
            return STRUNCATE;
        }
        _SAFECRT__RESET_STRING(_Dst, _SizeInBytes);
        _SAFECRT__RETURN_BUFFER_TOO_SMALL(_Dst, _SizeInBytes);
    }
    _SAFECRT__FILL_STRING(_Dst, _SizeInBytes, _SizeInBytes - available + 1);
    return 0;
}